

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void SetTexture(side_t *side,int position,char *name,FMissingTextureTracker *track)

{
  int iVar1;
  bool bVar2;
  FTextureID FVar3;
  FMissingCount *pFVar4;
  line_t *plVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  FString local_48;
  long local_40;
  char *local_38;
  
  FVar3 = FTextureManager::CheckForTexture(&TexMan,name,1,3);
  if (FVar3.texnum < 0) {
    local_38 = name;
    FString::FString(&local_48,name);
    pFVar4 = TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::
             operator[](track,&local_48);
    iVar1 = pFVar4->Count;
    pFVar4->Count = iVar1 + 1;
    FString::~FString(&local_48);
    FVar3 = TexMan.DefaultTexture;
    if ((iVar1 < 0x14) && (0 < numlines)) {
      local_40 = (ulong)(uint)position << 2;
      uVar7 = 0;
      plVar5 = lines;
      do {
        lVar6 = 0;
        bVar2 = true;
        do {
          bVar8 = bVar2;
          if (plVar5[uVar7].sidedef[lVar6] == side) {
            Printf("\x1cGUnknown %s texture \'\x1cI%s\x1cG\' on %s side of linedef %d\n",
                   _ZZL10SetTextureP6side_tiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEE13positionnames_rel
                   + *(int *)(
                             _ZZL10SetTextureP6side_tiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEE13positionnames_rel
                             + local_40),local_38,
                   (long)&
                         _ZZL10SetTextureP6side_tiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEE9sidenames_rel
                   + (long)(int)(&
                                _ZZL10SetTextureP6side_tiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEE9sidenames_rel
                                )[lVar6],uVar7 & 0xffffffff);
            plVar5 = lines;
          }
          lVar6 = 1;
          bVar2 = false;
        } while (bVar8);
        uVar7 = uVar7 + 1;
        FVar3.texnum = TexMan.DefaultTexture.texnum;
      } while ((long)uVar7 < (long)numlines);
    }
  }
  side->textures[position].texture.texnum = FVar3.texnum;
  return;
}

Assistant:

static void SetTexture (side_t *side, int position, const char *name, FMissingTextureTracker &track)
{
	static const char *positionnames[] = { "top", "middle", "bottom" };
	static const char *sidenames[] = { "first", "second" };

	FTextureID texture = TexMan.CheckForTexture (name, FTexture::TEX_Wall,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);

	if (!texture.Exists())
	{
		if (++track[name].Count <= MISSING_TEXTURE_WARN_LIMIT)
		{
			// Print an error that lists all references to this sidedef.
			// We must scan the linedefs manually for all references to this sidedef.
			for(int i = 0; i < numlines; i++)
			{
				for(int j = 0; j < 2; j++)
				{
					if (lines[i].sidedef[j] == side)
					{
						Printf(TEXTCOLOR_RED"Unknown %s texture '"
							TEXTCOLOR_ORANGE "%s" TEXTCOLOR_RED
							"' on %s side of linedef %d\n",
							positionnames[position], name, sidenames[j], i);
					}
				}
			}
		}
		texture = TexMan.GetDefaultTexture();
	}
	side->SetTexture(position, texture);
}